

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O2

void __thiscall OpenMD::DumpWriter::writeFrame(DumpWriter *this,ostream *os)

{
  int ioIndex;
  Molecule *pMVar1;
  StuntDouble *pSVar2;
  StuntDouble *sd;
  pointer ppSVar3;
  _func_int **pp_Var4;
  RigidBody *rb;
  DumpWriter *this_00;
  int siteIndex;
  MoleculeIterator mi;
  MoleculeIterator local_68;
  Molecule *local_60;
  pointer local_58;
  string local_50;
  
  local_68._M_node = (_Base_ptr)0x0;
  this_00 = (DumpWriter *)os;
  std::operator<<(os,"  <Snapshot>\n");
  writeFrameProperties(this_00,os,this->info_->sman_->currentSnapshot_);
  std::operator<<(os,"    <StuntDoubles>\n");
  pMVar1 = SimInfo::beginMolecule(this->info_,&local_68);
  while (pMVar1 != (Molecule *)0x0) {
    ppSVar3 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar3 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00128a12;
    pSVar2 = (StuntDouble *)0x0;
    while (pSVar2 != (StuntDouble *)0x0) {
      prepareDumpLine_abi_cxx11_(&local_50,this,pSVar2);
      std::operator<<(os,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      ppSVar3 = ppSVar3 + 1;
      pSVar2 = (StuntDouble *)0x0;
      if (ppSVar3 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00128a12:
        pSVar2 = *ppSVar3;
      }
    }
    pMVar1 = SimInfo::nextMolecule(this->info_,&local_68);
  }
  std::operator<<(os,"    </StuntDoubles>\n");
  if (this->doSiteData_ == true) {
    std::operator<<(os,"    <SiteData>\n");
    pMVar1 = SimInfo::beginMolecule(this->info_,&local_68);
    while (pMVar1 != (Molecule *)0x0) {
      ppSVar3 = (pMVar1->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_60 = pMVar1;
      if (ppSVar3 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00128b4c;
      pSVar2 = (StuntDouble *)0x0;
      while (pSVar2 != (StuntDouble *)0x0) {
        ioIndex = pSVar2->globalIntegrableObjectIndex_;
        prepareSiteLine_abi_cxx11_(&local_50,this,pSVar2,ioIndex,0);
        std::operator<<(os,(string *)&local_50);
        local_58 = ppSVar3;
        std::__cxx11::string::~string((string *)&local_50);
        if (pSVar2->objType_ == otRigidBody) {
          pp_Var4 = (_func_int **)pSVar2[2].mass_;
          siteIndex = 0;
          if (pp_Var4 != pSVar2[2].properties_._vptr_PropertyMap) goto LAB_00128b27;
          sd = (StuntDouble *)0x0;
          while (sd != (StuntDouble *)0x0) {
            prepareSiteLine_abi_cxx11_(&local_50,this,sd,ioIndex,siteIndex);
            std::operator<<(os,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            siteIndex = siteIndex + 1;
            pp_Var4 = pp_Var4 + 1;
            sd = (StuntDouble *)0x0;
            if (pp_Var4 != pSVar2[2].properties_._vptr_PropertyMap) {
LAB_00128b27:
              sd = (StuntDouble *)*pp_Var4;
            }
          }
        }
        ppSVar3 = local_58 + 1;
        pSVar2 = (StuntDouble *)0x0;
        if (ppSVar3 !=
            (local_60->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_00128b4c:
          pSVar2 = *ppSVar3;
        }
      }
      pMVar1 = SimInfo::nextMolecule(this->info_,&local_68);
    }
    std::operator<<(os,"    </SiteData>\n");
  }
  std::operator<<(os,"  </Snapshot>\n");
  std::ostream::flush();
  (**(code **)(**(long **)(os + *(long *)(*(long *)os + -0x18) + 0xe8) + 0x30))();
  return;
}

Assistant:

void DumpWriter::writeFrame(std::ostream& os) {
#ifdef IS_MPI
    MPI_Status istatus;
#endif

    Molecule* mol;
    StuntDouble* sd;
    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ii;
    RigidBody::AtomIterator ai;

#ifndef IS_MPI
    os << "  <Snapshot>\n";

    writeFrameProperties(os, info_->getSnapshotManager()->getCurrentSnapshot());

    os << "    <StuntDoubles>\n";
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        os << prepareDumpLine(sd);
      }
    }
    os << "    </StuntDoubles>\n";

    if (doSiteData_) {
      os << "    <SiteData>\n";
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (sd = mol->beginIntegrableObject(ii); sd != NULL;
             sd = mol->nextIntegrableObject(ii)) {
          int ioIndex = sd->getGlobalIntegrableObjectIndex();
          // do one for the IO itself
          os << prepareSiteLine(sd, ioIndex, 0);

          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            int siteIndex = 0;
            for (Atom* atom = rb->beginAtom(ai); atom != NULL;
                 atom       = rb->nextAtom(ai)) {
              os << prepareSiteLine(atom, ioIndex, siteIndex);
              siteIndex++;
            }
          }
        }
      }
      os << "    </SiteData>\n";
    }
    os << "  </Snapshot>\n";

    os.flush();
    os.rdbuf()->pubsync();
#else

    const int primaryNode = 0;
    int worldRank;
    int nProc;

    MPI_Comm_size(MPI_COMM_WORLD, &nProc);
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    if (worldRank == primaryNode) {
      os << "  <Snapshot>\n";
      writeFrameProperties(os,
                           info_->getSnapshotManager()->getCurrentSnapshot());
      os << "    <StuntDoubles>\n";
    }

    // every node prepares the dump lines for integrable objects belong to
    // itself
    std::string buffer;
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        buffer += prepareDumpLine(sd);
      }
    }

    if (worldRank == primaryNode) {
      os << buffer;

      for (int i = 1; i < nProc; ++i) {
        // tell processor i to start sending us data:

        MPI_Bcast(&i, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

        // receive the length of the string buffer that was
        // prepared by processor i:
        int recvLength;
        MPI_Recv(&recvLength, 1, MPI_INT, i, MPI_ANY_TAG, MPI_COMM_WORLD,
                 &istatus);

        // create a buffer to receive the data
        char* recvBuffer = new char[recvLength];
        if (recvBuffer == NULL) {
        } else {
          // receive the data:
          MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, MPI_ANY_TAG,
                   MPI_COMM_WORLD, &istatus);
          // send it to the file:
          os << recvBuffer;
          // get rid of the receive buffer:
          delete[] recvBuffer;
        }
      }
    } else {
      int sendBufferLength = buffer.size() + 1;
      int myturn           = 0;
      for (int i = 1; i < nProc; ++i) {
        // wait for the primary node to call our number:
        MPI_Bcast(&myturn, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        if (myturn == worldRank) {
          // send the length of our buffer:

          MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0,
                   MPI_COMM_WORLD);

          // send our buffer:
          MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR,
                   primaryNode, 0, MPI_COMM_WORLD);
        }
      }
    }

    if (worldRank == primaryNode) { os << "    </StuntDoubles>\n"; }

    if (doSiteData_) {
      if (worldRank == primaryNode) { os << "    <SiteData>\n"; }
      buffer.clear();
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (sd = mol->beginIntegrableObject(ii); sd != NULL;
             sd = mol->nextIntegrableObject(ii)) {
          int ioIndex = sd->getGlobalIntegrableObjectIndex();
          // do one for the IO itself
          buffer += prepareSiteLine(sd, ioIndex, 0);

          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            int siteIndex = 0;
            for (Atom* atom = rb->beginAtom(ai); atom != NULL;
                 atom       = rb->nextAtom(ai)) {
              buffer += prepareSiteLine(atom, ioIndex, siteIndex);
              siteIndex++;
            }
          }
        }
      }

      if (worldRank == primaryNode) {
        os << buffer;

        for (int i = 1; i < nProc; ++i) {
          // tell processor i to start sending us data:
          MPI_Bcast(&i, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

          // receive the length of the string buffer that was
          // prepared by processor i:
          int recvLength;
          MPI_Recv(&recvLength, 1, MPI_INT, i, MPI_ANY_TAG, MPI_COMM_WORLD,
                   &istatus);

          // create a buffer to receive the data
          char* recvBuffer = new char[recvLength];
          if (recvBuffer == NULL) {
          } else {
            // receive the data:
            MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, MPI_ANY_TAG,
                     MPI_COMM_WORLD, &istatus);
            // send it to the file:
            os << recvBuffer;
            // get rid of the receive buffer:
            delete[] recvBuffer;
          }
        }
      } else {
        int sendBufferLength = buffer.size() + 1;
        int myturn           = 0;
        for (int i = 1; i < nProc; ++i) {
          // wait for the primary node to call our number:
          MPI_Bcast(&myturn, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
          if (myturn == worldRank) {
            // send the length of our buffer:
            MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0,
                     MPI_COMM_WORLD);
            // send our buffer:
            MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR,
                     primaryNode, 0, MPI_COMM_WORLD);
          }
        }
      }

      if (worldRank == primaryNode) { os << "    </SiteData>\n"; }
    }

    if (worldRank == primaryNode) {
      os << "  </Snapshot>\n";
      os.flush();
      os.rdbuf()->pubsync();
    }

#endif  // is_mpi
  }